

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O0

unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_> __thiscall
verilogAST::WireReadCounter::process_assign<verilogAST::BlockingAssign>
          (WireReadCounter *this,
          unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
          *node)

{
  pointer pBVar1;
  unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_> *in_RDX;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_30;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_28 [2];
  unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
  *node_local;
  WireReadCounter *this_local;
  
  node_local = node;
  this_local = this;
  pBVar1 = std::
           unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
           ::operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_30,
             (unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
             (pBVar1 + 0x20));
  (**(code **)(node->_M_t).
              super___uniq_ptr_impl<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::BlockingAssign_*,_std::default_delete<verilogAST::BlockingAssign>_>
              .super__Head_base<0UL,_verilogAST::BlockingAssign_*,_false>._M_head_impl)
            (local_28,node,&local_30);
  pBVar1 = std::
           unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
           ::operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            ((unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
             (pBVar1 + 0x20),local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_30);
  std::unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>::
  unique_ptr((unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
              *)this,in_RDX);
  return (__uniq_ptr_data<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>,_true,_true>
          )(__uniq_ptr_data<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> WireReadCounter::process_assign(std::unique_ptr<T> node) {
  node->value = this->visit(std::move(node->value));
  return node;
}